

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexed_vector.cc
# Opt level: O0

void __thiscall ipx::IndexedVector::set_to_zero(IndexedVector *this)

{
  bool bVar1;
  reference pvVar2;
  double *pdVar3;
  valarray<double> *in_RDI;
  Int p;
  double *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar4;
  
  bVar1 = sparse((IndexedVector *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  if (bVar1) {
    for (iVar4 = 0; iVar4 < *(int *)&in_RDI[2]._M_data; iVar4 = iVar4 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),(long)iVar4);
      pdVar3 = std::valarray<double>::operator[](in_RDI,(long)*pvVar2);
      *pdVar3 = 0.0;
    }
  }
  else {
    std::valarray<double>::operator=(in_RDI,in_stack_ffffffffffffffd8);
  }
  *(undefined4 *)&in_RDI[2]._M_data = 0;
  return;
}

Assistant:

void IndexedVector::set_to_zero() {
    if (sparse()) {
        for (Int p = 0; p < nnz_; p++)
            elements_[pattern_[p]] = 0.0;
    } else {
        elements_ = 0.0;
    }
    nnz_ = 0;
}